

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O1

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests,char *value,size_t len)

{
  size_t *psVar1;
  h2o_cache_digests_frame_t *phVar2;
  size_t sVar3;
  h2o_cache_digests_t **pphVar4;
  int iVar5;
  char *src;
  long lVar6;
  h2o_cache_digests_t *phVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  h2o_cache_digests_frame_vector_t *unaff_RBP;
  byte *pbVar13;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  char *unaff_R15;
  char *target;
  bool bVar17;
  bool bVar18;
  h2o_iovec_t hVar19;
  size_t token_len;
  size_t gcs_base64_len;
  h2o_iovec_t token_value;
  h2o_iovec_t iter;
  int local_bc;
  size_t local_b8;
  h2o_cache_digests_t **local_b0;
  h2o_vector_t local_a8;
  undefined8 uStack_90;
  long local_80;
  char *local_78;
  ulong local_70;
  char *local_68;
  byte *local_60;
  size_t local_58;
  h2o_iovec_t local_50;
  h2o_iovec_t local_40;
  
  local_b0 = digests;
  local_40.base = value;
  local_40.len = len;
  do {
    src = h2o_next_token(&local_40,0x3b,&local_58,(h2o_iovec_t *)0x0);
    if (src != (char *)0x0) {
      unaff_R15 = h2o_next_token(&local_40,0x3b,&local_b8,&local_50);
      if (unaff_R15 == (char *)0x0) {
        local_80 = 0;
        bVar18 = true;
        local_bc = 0;
        bVar12 = true;
      }
      else {
        bVar12 = false;
        local_bc = 0;
        unaff_RBP = (h2o_cache_digests_frame_vector_t *)0x0;
        bVar18 = false;
        do {
          if (local_b8 == 5) {
            iVar5 = h2o__lcstris_core(unaff_R15,"reset",5);
            if (iVar5 == 0) goto LAB_0014ad9e;
            bVar18 = true;
          }
          else {
            if ((local_b8 == 1) && (*unaff_R15 == ',')) break;
LAB_0014ad9e:
            if ((local_b8 == 10) &&
               (iVar5 = h2o__lcstris_core(unaff_R15,"validators",10), iVar5 != 0)) {
              unaff_RBP = (h2o_cache_digests_frame_vector_t *)0x1;
            }
            else {
              bVar17 = true;
              if (local_b8 == 8) {
                iVar5 = h2o__lcstris_core(unaff_R15,"complete",8);
                bVar17 = iVar5 == 0;
              }
              if (bVar17) {
                bVar12 = true;
              }
              else {
                local_bc = 1;
              }
            }
          }
          unaff_R15 = h2o_next_token(&local_40,0x3b,&local_b8,&local_50);
        } while (unaff_R15 != (char *)0x0);
        bVar18 = !bVar18;
        bVar12 = !bVar12;
        local_80 = 0x18;
        digests = local_b0;
        if ((int)unaff_RBP == 0) {
          local_80 = 0;
        }
      }
      if ((!bVar18) &&
         (unaff_RBP = (h2o_cache_digests_frame_vector_t *)*digests,
         unaff_RBP != (h2o_cache_digests_frame_vector_t *)0x0)) {
        dispose_frame_vector(unaff_RBP);
        dispose_frame_vector(unaff_RBP + 1);
        free(unaff_RBP);
        *digests = (h2o_cache_digests_t *)0x0;
      }
      if (bVar12) {
        local_a8.capacity = 0;
        uStack_90 = 0;
        local_a8.entries = (uint64_t *)0x0;
        local_a8.size = 0;
        local_68 = src;
        hVar19 = h2o_decode_base64url((h2o_mem_pool_t *)0x0,src,local_58);
        local_78 = hVar19.base;
        if (local_78 != (char *)0x0) {
          pbVar14 = (byte *)(local_78 + -1);
          pbVar13 = (byte *)(local_78 + hVar19.len);
          uVar15 = 0;
          iVar8 = -5;
          iVar5 = 0;
          do {
            if (uVar15 == 0) {
              pbVar14 = pbVar14 + 1;
              if (pbVar14 != pbVar13) {
                uVar15 = 8;
                goto LAB_0014aef0;
              }
              uVar10 = 0xffffffff;
            }
            else {
LAB_0014aef0:
              uVar15 = uVar15 - 1;
              uVar10 = (uint)((*pbVar14 >> (uVar15 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0xffffffff) break;
            iVar5 = uVar10 + iVar5 * 2;
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          if (uVar10 != 0xffffffff) {
            iVar8 = -5;
            uVar10 = 0;
            do {
              if (uVar15 == 0) {
                pbVar14 = pbVar14 + 1;
                if (pbVar14 != pbVar13) {
                  uVar15 = 8;
                  goto LAB_0014af3c;
                }
                uVar9 = 0xffffffff;
              }
              else {
LAB_0014af3c:
                uVar15 = uVar15 - 1;
                uVar9 = (uint)((*pbVar14 >> (uVar15 & 0x1f) & 1) != 0);
              }
              if (uVar9 == 0xffffffff) break;
              uVar10 = uVar9 + uVar10 * 2;
              iVar8 = iVar8 + 1;
            } while (iVar8 != 0);
            if (uVar9 != 0xffffffff) {
              uStack_90 = CONCAT44(uStack_90._4_4_,iVar5 + uVar10);
              local_70 = (ulong)uVar10;
              uVar16 = 0xffffffffffffffff;
              local_60 = pbVar13;
LAB_0014af87:
              pphVar4 = local_b0;
              lVar6 = 0;
              do {
                if (uVar15 == 0) {
                  pbVar14 = pbVar14 + 1;
                  if (pbVar14 != pbVar13) {
                    uVar15 = 8;
                    goto LAB_0014af9c;
                  }
                  uVar9 = 0xffffffff;
                }
                else {
LAB_0014af9c:
                  uVar15 = uVar15 - 1;
                  uVar9 = (uint)((*pbVar14 >> (uVar15 & 0x1f) & 1) != 0);
                }
                if (uVar9 != 0) goto LAB_0014afbd;
                lVar6 = lVar6 + 1;
              } while( true );
            }
          }
        }
LAB_0014b120:
        free(local_a8.entries);
        free(local_78);
        digests = local_b0;
        src = local_68;
      }
    }
    if ((src == (char *)0x0) || (unaff_R15 == (char *)0x0)) {
      return;
    }
  } while( true );
LAB_0014afbd:
  if (uVar9 != 0xffffffff) {
    unaff_RBP = (h2o_cache_digests_frame_vector_t *)0x0;
    for (uVar9 = uVar10; uVar9 != 0; uVar9 = uVar9 - 1) {
      if (uVar15 == 0) {
        pbVar14 = pbVar14 + 1;
        if (pbVar14 != pbVar13) {
          uVar15 = 8;
          goto LAB_0014afdd;
        }
        uVar11 = 0xffffffff;
      }
      else {
LAB_0014afdd:
        uVar15 = uVar15 - 1;
        uVar11 = (uint)((*pbVar14 >> (uVar15 & 0x1f) & 1) != 0);
      }
      bVar18 = uVar11 == 0xffffffff;
      if (bVar18) goto LAB_0014b00d;
      unaff_RBP = (h2o_cache_digests_frame_vector_t *)((long)(int)uVar11 + (long)unaff_RBP * 2);
    }
    bVar18 = false;
LAB_0014b00d:
    if (!bVar18) {
      unaff_RBP = (h2o_cache_digests_frame_vector_t *)
                  ((long)&unaff_RBP->entries + (lVar6 << ((byte)local_70 & 0x3f)));
      bVar18 = true;
      goto LAB_0014b023;
    }
  }
  bVar18 = false;
LAB_0014b023:
  if (!bVar18) {
    if (*local_b0 == (h2o_cache_digests_t *)0x0) {
      phVar7 = (h2o_cache_digests_t *)malloc(0x38);
      if (phVar7 == (h2o_cache_digests_t *)0x0) {
        h2o__fatal(
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                  );
      }
      *pphVar4 = phVar7;
      (phVar7->fresh).url_and_etag.size = 0;
      (phVar7->fresh).url_and_etag.capacity = 0;
      (phVar7->fresh).url_only.capacity = 0;
      (phVar7->fresh).url_and_etag.entries = (h2o_cache_digests_frame_t *)0x0;
      (phVar7->fresh).url_only.entries = (h2o_cache_digests_frame_t *)0x0;
      (phVar7->fresh).url_only.size = 0;
      *(undefined8 *)&(phVar7->fresh).complete = 0;
    }
    phVar7 = *pphVar4;
    unaff_RBP = (h2o_cache_digests_frame_vector_t *)
                ((long)&(phVar7->fresh).url_only.entries + local_80);
    uVar16 = *(long *)((long)&(phVar7->fresh).url_only.size + local_80) + 1;
    if (*(ulong *)((long)&(phVar7->fresh).url_only.capacity + local_80) < uVar16) {
      h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)unaff_RBP,0x20,uVar16);
    }
    phVar2 = unaff_RBP->entries;
    sVar3 = unaff_RBP->size;
    unaff_RBP->size = sVar3 + 1;
    psVar1 = &phVar2[sVar3].keys.capacity;
    *psVar1 = local_a8.capacity;
    psVar1[1] = uStack_90;
    phVar2 = phVar2 + sVar3;
    (phVar2->keys).entries = (uint64_t *)local_a8.entries;
    (phVar2->keys).size = local_a8.size;
    local_a8.entries = (uint64_t *)0x0;
    local_a8.size = 0;
    local_a8.capacity = 0;
    uStack_90 = 0;
    ((*pphVar4)->fresh).complete = local_bc;
    goto LAB_0014b120;
  }
  uVar16 = (long)&unaff_RBP->entries + uVar16 + 1;
  if (uVar16 >> ((byte)uStack_90 & 0x3f) != 0) goto LAB_0014b120;
  if (local_a8.capacity < local_a8.size + 1) {
    h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_a8,8,local_a8.size + 1);
    pbVar13 = local_60;
  }
  *(ulong *)((long)local_a8.entries + local_a8.size * 8) = uVar16;
  local_a8.size = local_a8.size + 1;
  goto LAB_0014af87;
}

Assistant:

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests, const char *value, size_t len)
{
    h2o_iovec_t iter = h2o_iovec_init(value, len);
    const char *token;
    size_t token_len;

    do {
        const char *gcs_base64;
        size_t gcs_base64_len;
        int reset = 0, validators = 0, complete = 0, skip = 0;
        h2o_iovec_t token_value;

        if ((gcs_base64 = h2o_next_token(&iter, ';', &gcs_base64_len, NULL)) == NULL)
            return;
        while ((token = h2o_next_token(&iter, ';', &token_len, &token_value)) != NULL &&
               !h2o_memis(token, token_len, H2O_STRLIT(","))) {
            if (h2o_lcstris(token, token_len, H2O_STRLIT("reset"))) {
                reset = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("validators"))) {
                validators = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("complete"))) {
                complete = 1;
            } else {
                skip = 1;
            }
        }

        if (reset && *digests != NULL) {
            h2o_cache_digests_destroy(*digests);
            *digests = NULL;
        }

        if (skip) {
            /* not supported for the time being */
        } else {
            load_digest(digests, gcs_base64, gcs_base64_len, validators, complete);
        }
    } while (token != NULL);
}